

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_transaction.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_>::
key(transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this,string *s)

{
  bool bVar1;
  string_mapping *psVar2;
  error_code eVar3;
  string *s_local;
  transaction_contents<pstore::lock_guard<pstore::transaction_mutex>_> *this_local;
  error_category *local_10;
  
  bVar1 = std::operator==(s,"names");
  if (bVar1) {
    eVar3 = push_array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>
                      (&this->super_rule,&this->transaction_,(this->names_).ptr_);
    local_10 = eVar3._M_cat;
    this_local._0_4_ = eVar3._M_value;
  }
  else {
    bVar1 = std::operator==(s,"paths");
    if (bVar1) {
      eVar3 = push_array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping*>>
                        (&this->super_rule,&this->transaction_,(this->paths_).ptr_);
      local_10 = eVar3._M_cat;
      this_local._0_4_ = eVar3._M_value;
    }
    else {
      bVar1 = std::operator==(s,"debugline");
      if (bVar1) {
        eVar3 = push_object_rule<pstore::exchange::import_ns::debug_line_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*>
                          (&this->super_rule,&this->transaction_);
        local_10 = eVar3._M_cat;
        this_local._0_4_ = eVar3._M_value;
      }
      else {
        bVar1 = std::operator==(s,"fragments");
        if (bVar1) {
          psVar2 = gsl::not_null<pstore::exchange::import_ns::string_mapping_*>::get(&this->names_);
          eVar3 = push_object_rule<pstore::exchange::import_ns::fragment_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
                            (&this->super_rule,&this->transaction_,psVar2);
          local_10 = eVar3._M_cat;
          this_local._0_4_ = eVar3._M_value;
        }
        else {
          bVar1 = std::operator==(s,"compilations");
          if (bVar1) {
            psVar2 = gsl::not_null<pstore::exchange::import_ns::string_mapping_*>::get
                               (&this->names_);
            eVar3 = push_object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
                              (&this->super_rule,&this->transaction_,psVar2);
            local_10 = eVar3._M_cat;
            this_local._0_4_ = eVar3._M_value;
          }
          else {
            std::error_code::error_code<pstore::exchange::import_ns::error,void>
                      ((error_code *)&this_local,unknown_transaction_object_key);
          }
        }
      }
    }
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)this_local;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

std::error_code transaction_contents<TransactionLock>::key (std::string const & s) {
                // TODO: check that "names" is the first key that we see.
                if (s == "names") {
                    return push_array_rule<strings_array_members> (this, &transaction_, names_);
                }
                if (s == "paths") {
                    return push_array_rule<strings_array_members> (this, &transaction_, paths_);
                }
                if (s == "debugline") {
                    return push_object_rule<debug_line_index> (this, &transaction_);
                }
                if (s == "fragments") {
                    return push_object_rule<fragment_index> (this, &transaction_, names_.get ());
                }
                if (s == "compilations") {
                    return push_object_rule<compilations_index> (this, &transaction_,
                                                                 names_.get ());
                }
                return error::unknown_transaction_object_key;
            }